

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterplayer.cpp
# Opt level: O0

bool TryPunch(APlayerPawn *pmo,DAngle *angle,int damage,int power)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  TAngle<double> local_88;
  TFlags<ActorFlag3,_unsigned_int> local_80;
  FName local_7c;
  TAngle<double> local_78;
  TAngle<double> local_70;
  TAngle<double> local_68;
  undefined1 local_60 [16];
  TAngle<double> local_50;
  DAngle slope;
  FTranslatedLineTarget t;
  PClassActor *pufftype;
  int power_local;
  int damage_local;
  DAngle *angle_local;
  APlayerPawn *pmo_local;
  
  FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)&slope);
  TAngle<double>::TAngle(&local_50);
  TAngle<double>::TAngle((TAngle<double> *)local_60,angle);
  TAngle<double>::TAngle(&local_68,0.0);
  P_AimLineAttack((AActor *)(local_60 + 8),(DAngle *)pmo,128.0,(FTranslatedLineTarget *)local_60,
                  &slope,(int)&local_68,(AActor *)0x0,(AActor *)0x0);
  TAngle<double>::operator=(&local_50,(TAngle<double> *)(local_60 + 8));
  if (slope.Degrees != 0.0) {
    iVar1 = (pmo->super_AActor).weaponspecial + 1;
    (pmo->super_AActor).weaponspecial = iVar1;
    if (iVar1 < 3) {
      t._16_8_ = PClass::FindActor("PunchPuff");
      pufftype._0_4_ = power;
      pufftype._4_4_ = damage;
    }
    else {
      pufftype._4_4_ = damage << 1;
      pufftype._0_4_ = power * 3;
      t._16_8_ = PClass::FindActor("HammerPuff");
    }
    TAngle<double>::TAngle(&local_70,angle);
    TAngle<double>::TAngle(&local_78,&local_50);
    FName::FName(&local_7c,NAME_Melee);
    P_LineAttack(&pmo->super_AActor,&local_70,128.0,&local_78,pufftype._4_4_,&local_7c,
                 (PClassActor *)t._16_8_,1,(FTranslatedLineTarget *)&slope,(int *)0x0);
    if (slope.Degrees != 0.0) {
      bVar3 = true;
      if ((*(long *)((long)slope.Degrees + 0x200) == 0) &&
         (bVar3 = false, *(int *)((long)slope.Degrees + 0x3b8) != 0x7fffffff)) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_80,
                   SUB84(slope.Degrees,0) +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_80);
        bVar3 = uVar2 != 0;
      }
      if (bVar3) {
        TAngle<double>::TAngle(&local_88,(TAngle<double> *)&t);
        AActor::Thrust((AActor *)slope.Degrees,&local_88,(double)(int)pufftype);
      }
      AdjustPlayerAngle(&pmo->super_AActor,(FTranslatedLineTarget *)&slope);
      return true;
    }
  }
  return false;
}

Assistant:

static bool TryPunch(APlayerPawn *pmo, DAngle angle, int damage, int power)
{
	PClassActor *pufftype;
	FTranslatedLineTarget t;
	DAngle slope;

	slope = P_AimLineAttack (pmo, angle, 2*MELEERANGE, &t);
	if (t.linetarget != NULL)
	{
		if (++pmo->weaponspecial >= 3)
		{
			damage <<= 1;
			power *= 3;
			pufftype = PClass::FindActor("HammerPuff");
		}
		else
		{
			pufftype = PClass::FindActor("PunchPuff");
		}
		P_LineAttack (pmo, angle, 2*MELEERANGE, slope, damage, NAME_Melee, pufftype, true, &t);
		if (t.linetarget != NULL)
		{
			if (t.linetarget->player != NULL || 
				(t.linetarget->Mass != INT_MAX && (t.linetarget->flags3 & MF3_ISMONSTER)))
			{
				t.linetarget->Thrust(t.angleFromSource, power);
			}
			AdjustPlayerAngle (pmo, &t);
			return true;
		}
	}
	return false;
}